

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3.cpp
# Opt level: O2

Vector3 * __thiscall Vector3::reflect(Vector3 *__return_storage_ptr__,Vector3 *this,Vector3 *n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = dot(this,n);
  dVar5 = dVar5 + dVar5;
  dVar1 = n->z;
  dVar2 = this->z;
  dVar3 = n->y;
  dVar4 = this->y;
  __return_storage_ptr__->x = this->x - dVar5 * n->x;
  __return_storage_ptr__->y = dVar4 - dVar5 * dVar3;
  __return_storage_ptr__->z = dVar2 - dVar1 * dVar5;
  return __return_storage_ptr__;
}

Assistant:

Vector3 Vector3::reflect(const Vector3& n) const
{
    return *this - n * (2 * this->dot(n));
}